

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O1

int main(int argc,char **argv)

{
  Result RVar1;
  StageResult SVar2;
  Emulator *e;
  int iVar3;
  Buffer rom;
  Buffer local_20;
  
  if (argc == 2) {
    RVar1 = read_file(argv[1],&local_20);
    iVar3 = 1;
    if (RVar1 == OK) {
      e = (Emulator *)malloc(0x800f8);
      memset(e,0,0x800f8);
      (e->state).reg[0x15] = 0xf0;
      (e->rom).data = local_20.data;
      (e->rom).size = local_20.size;
      (e->state).pc = 0xe000480;
      (e->state).pipeline.if_.s.active = true;
      e->verbosity = 0;
      iVar3 = 1500000;
      do {
        SVar2 = step(e);
        if (SVar2 == STAGE_RESULT_UNIMPLEMENTED) {
          e->verbosity = 2;
          step(e);
          break;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      free(e);
      iVar3 = 0;
    }
  }
  else {
    main_cold_1();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  --argc; ++argv;
  int result = 1;
  CHECK_MSG(argc == 1, "no rom file given.\n");
  const char* rom_filename = argv[0];

  Buffer rom;
  CHECK(SUCCESS(read_file(rom_filename, &rom)));
  Emulator* e = malloc(sizeof(Emulator));
  init_emulator(e, &rom);

  e->verbosity = 0;

  StageResult sr;
  int i;
  for (i = 0; i < 1500000; ++i) {
    sr = step(e);

    if (sr == STAGE_RESULT_UNIMPLEMENTED) {
      e->verbosity = 2;
      step(e);
      break;
    }
  }

  free(e);

  return 0;
  ON_ERROR_RETURN;
}